

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  undefined4 *puVar1;
  bool failure;
  bool success;
  DebugExpression<bool> _kjCondition;
  UnwindDetector _kjUnwindDetector140;
  DebugExpression<bool_&> _kjCondition_2;
  UnwindDetector _kjUnwindDetector155;
  UnwindDetector _kjUnwindDetector141;
  
  success = false;
  UnwindDetector::UnwindDetector(&_kjUnwindDetector140);
  _kjCondition_2.value._0_1_ = 1;
  UnwindDetector::UnwindDetector(&_kjUnwindDetector141);
  _kjUnwindDetector155.uncaughtCount._0_1_ = 1;
  _kjCondition.value = (bool)(success ^ 1);
  if ((success & Debug::minSeverity < 3) != 0) {
    Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x8f,ERROR,"\"failed: expected \" \"!(success)\", _kjCondition",
               (char (*) [28])"failed: expected !(success)",&_kjCondition);
  }
  _kjCondition.value = true;
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++:141:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:141:5)>
               *)&_kjUnwindDetector155);
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++:140:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_exception_test_c__:140:5)>
               *)&_kjCondition_2);
  _kjCondition_2.value = &success;
  if (Debug::minSeverity < 3 && success == false) {
    Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x93,ERROR,"\"failed: expected \" \"success\", _kjCondition",
               (char (*) [25])"failed: expected success",&_kjCondition_2);
  }
  _kjCondition_2.value = (bool *)((ulong)_kjCondition_2.value & 0xffffffffffffff00 ^ 1);
  success = false;
  UnwindDetector::UnwindDetector((UnwindDetector *)&_kjCondition_2);
  UnwindDetector::UnwindDetector(&_kjUnwindDetector155);
  _kjUnwindDetector140.uncaughtCount._0_1_ = success ^ 1;
  if ((success & Debug::minSeverity < 3) != 0) {
    Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x9d,ERROR,"\"failed: expected \" \"!(success)\", _kjCondition",
               (char (*) [28])"failed: expected !(success)",
               (DebugExpression<bool> *)&_kjUnwindDetector140);
  }
  _kjUnwindDetector140.uncaughtCount._0_1_ = 1;
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 1;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TEST(Exception, ScopeSuccessFail) {
  bool success = false;
  bool failure = false;

  {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);
  }

  EXPECT_TRUE(success);
  EXPECT_FALSE(failure);

  success = false;
  failure = false;

  try {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);

    throw 1;
  } catch (int) {}

  EXPECT_FALSE(success);
  EXPECT_TRUE(failure);
}